

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v6::internal::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  char format [7];
  undefined1 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffa9;
  char cVar17;
  byte in_stack_ffffffffffffffaa;
  undefined5 in_stack_ffffffffffffffab;
  char *in_stack_ffffffffffffffb0;
  
  if (buf->capacity_ <= buf->size_) {
    assert_fail(in_stack_ffffffffffffffb0,0,
                (char *)CONCAT53(in_stack_ffffffffffffffab,
                                 CONCAT12(in_stack_ffffffffffffffaa,
                                          CONCAT11(in_stack_ffffffffffffffa9,
                                                   in_stack_ffffffffffffffa8))));
  }
  uVar12 = 5;
  if (-1 < precision) {
    uVar12 = precision - 1;
  }
  bVar11 = specs._4_1_;
  uVar10 = (ulong)uVar12;
  if (1 < bVar11) {
    uVar10 = (ulong)(uint)precision;
  }
  cVar17 = '%';
  uVar12 = specs._4_4_;
  if (bVar11 == 3 && (uVar12 >> 0x15 & 1) != 0) {
    pbVar6 = &stack0xffffffffffffffab;
    in_stack_ffffffffffffffaa = 0x23;
  }
  else {
    pbVar6 = &stack0xffffffffffffffaa;
  }
  if (-1 < (int)uVar10) {
    pbVar6[0] = 0x2e;
    pbVar6[1] = 0x2a;
    pbVar6 = pbVar6 + 2;
  }
  if (bVar11 == 3) {
    bVar8 = ((uVar12 >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar8 = (bVar11 == 2) + 0x65;
  }
  *pbVar6 = bVar8;
  pbVar6[1] = 0;
  sVar3 = buf->size_;
  pcVar16 = (char *)(sVar3 + 1);
LAB_001435d2:
  while( true ) {
    pcVar15 = buf->ptr_ + sVar3;
    uVar9 = buf->capacity_ - sVar3;
    if ((int)uVar10 < 0) {
      uVar5 = snprintf(pcVar15,uVar9,&stack0xffffffffffffffa9,value);
    }
    else {
      uVar5 = snprintf(pcVar15,uVar9,&stack0xffffffffffffffa9,value,uVar10);
    }
    uVar14 = (ulong)uVar5;
    if ((int)uVar5 < 0) goto LAB_00143639;
    if (uVar14 < uVar9) break;
    pcVar15 = pcVar16 + uVar14;
    if ((char *)buf->capacity_ < pcVar15) goto LAB_00143647;
  }
  if (bVar11 == 2) {
    if (precision != 0) {
      uVar10 = 1;
      do {
        lVar7 = uVar10 + (uVar14 - 2);
        uVar10 = uVar10 - 1;
      } while ((byte)(pcVar15[lVar7] - 0x30U) < 10);
      if (0 < (int)uVar10) {
LAB_0014380b:
        assert_fail(pcVar16,0,
                    (char *)CONCAT53(in_stack_ffffffffffffffab,
                                     CONCAT12(in_stack_ffffffffffffffaa,
                                              CONCAT11(cVar17,in_stack_ffffffffffffffa8))));
      }
      memmove(pcVar15 + uVar10 + uVar14 + -1,pcVar15 + uVar10 + uVar14,
              (ulong)(-(int)uVar10 & 0x7fffffff));
      uVar9 = (ulong)(uVar5 - 1);
      if (buf->capacity_ < uVar9) {
        (**buf->_vptr_buffer)(buf,uVar9);
      }
      buf->size_ = uVar9;
      goto LAB_001437c2;
    }
    if (buf->capacity_ < uVar14) {
      (**buf->_vptr_buffer)(buf,uVar14);
    }
    buf->size_ = uVar14;
  }
  else {
    if ((uVar12 & 0xff) != 3) {
      lVar7 = -2;
      uVar10 = uVar14 - 1;
      do {
        uVar9 = uVar10;
        lVar7 = lVar7 + 1;
        uVar10 = uVar9 - 1;
      } while (pcVar15[uVar9] != 'e');
      cVar2 = pcVar15[uVar9 + 1];
      if ((cVar2 != '+') && (cVar2 != '-')) {
        __assert_fail("sign == \'+\' || sign == \'-\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/spdlog/fmt/bundled/format-inl.h"
                      ,0x4ab,
                      "int fmt::internal::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                     );
      }
      lVar7 = -lVar7;
      iVar13 = 0;
      do {
        if (9 < (byte)(pcVar15[lVar7 + uVar14] - 0x30U)) {
          __assert_fail("is_digit(*p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/spdlog/fmt/bundled/format-inl.h"
                        ,0x4af,
                        "int fmt::internal::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                       );
        }
        iVar13 = (uint)(byte)pcVar15[lVar7 + uVar14] + iVar13 * 10 + -0x30;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
      iVar4 = -iVar13;
      if (cVar2 != '-') {
        iVar4 = iVar13;
      }
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        do {
          pcVar1 = pcVar15 + uVar10;
          uVar10 = uVar10 - 1;
        } while (*pcVar1 == '0');
        if ((int)(uint)uVar10 < 0) goto LAB_0014380b;
        memmove(pcVar15 + 1,pcVar15 + 2,(ulong)((uint)uVar10 & 0x7fffffff));
      }
      pcVar16 = pcVar16 + (uVar10 & 0xffffffff);
      if ((char *)buf->capacity_ < pcVar16) {
        (**buf->_vptr_buffer)(buf,pcVar16);
      }
      buf->size_ = (size_t)pcVar16;
      uVar10 = (ulong)(uint)(iVar4 - (int)uVar10);
      goto LAB_001437c2;
    }
    uVar14 = sVar3 + uVar14;
    if (buf->capacity_ < uVar14) {
      (**buf->_vptr_buffer)(buf,uVar14);
    }
    buf->size_ = uVar14;
  }
  uVar10 = 0;
LAB_001437c2:
  return (int)uVar10;
LAB_00143639:
  if (buf->capacity_ != 0xffffffffffffffff) {
    pcVar15 = (char *)(buf->capacity_ + 1);
LAB_00143647:
    (**buf->_vptr_buffer)(buf,pcVar15);
  }
  goto LAB_001435d2;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // Ths longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto becase of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      buf.reserve(buf.capacity() + 1);  // The buffer will grow exponentially.
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}